

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O0

MPP_RET hal_jpege_vepu1_part_start(void *hal,HalEncTask *task)

{
  RK_U32 RVar1;
  uint uVar2;
  RK_U32 start_mbrow;
  undefined4 uVar3;
  JpegeSyntax *syntax_00;
  long lVar4;
  int iVar5;
  bool bVar6;
  undefined8 uStack_78;
  RK_U32 reg_size;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  RK_U32 part_not_end;
  RK_U32 part_y_fill;
  RK_U32 part_enc_mcu_h;
  RK_U32 part_enc_h;
  RK_U32 *regs;
  RK_U32 part_mcu_h;
  RK_U32 mcu_y;
  RK_U32 mcu_h;
  RK_U32 mcu_w;
  JpegeSyntax *syntax;
  HalJpegeCtx *ctx;
  MPP_RET ret;
  HalEncTask *task_local;
  void *hal_local;
  
  syntax_00 = (JpegeSyntax *)(task->syntax).data;
  RVar1 = syntax_00->mcu_hor_cnt;
  uVar2 = syntax_00->mcu_ver_cnt;
  start_mbrow = *(RK_U32 *)((long)hal + 0x104);
  part_not_end = syntax_00->part_rows;
  lVar4 = *(long *)((long)hal + 0x18);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter part start %p\n","hal_jpege_vepu1_part_start",hal);
  }
  task->part_first = (uint)((start_mbrow != 0 ^ 0xffU) & 1);
  bVar6 = uVar2 <= start_mbrow + part_not_end;
  if (bVar6) {
    part_not_end = syntax_00->height + start_mbrow * -0x10 + 0xf >> 4;
    wr_cfg.offset = *(RK_U32 *)((long)hal + 0x124);
    task->part_last = 1;
  }
  else {
    wr_cfg.offset = 0;
    task->part_last = 0;
  }
  wr_cfg.size = (RK_U32)!bVar6;
  if ((hal_jpege_debug & 4) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","part first %d last %d\n",(char *)0x0,(ulong)task->part_first,
               (ulong)task->part_last);
  }
  get_msb_lsb_at_pos((RK_U32 *)(lVar4 + 0x58),(RK_U32 *)(lVar4 + 0x5c),
                     *(RK_U8 **)((long)hal + 0x108),*(RK_U32 *)((long)hal + 0x11c));
  *(int *)(lVar4 + 0x60) = (int)*(undefined8 *)((long)hal + 0x110) - *(int *)((long)hal + 0x11c);
  *(uint *)(lVar4 + 0x3c) = *(uint *)(lVar4 + 0x3c) & 0xfffffc3f | wr_cfg.offset << 6;
  *(uint *)(lVar4 + 0x94) = (*(uint *)((long)hal + 0x11c) & 7) << 0x1a;
  iVar5 = mpp_buffer_get_fd_with_caller(task->output,"hal_jpege_vepu1_part_start");
  *(int *)(lVar4 + 0x14) = iVar5;
  if (*(int *)((long)hal + 0x11c) != 0) {
    mpp_dev_set_reg_offset(*hal,5,*(RK_U32 *)((long)hal + 0x11c));
  }
  *(RK_U32 *)(lVar4 + 0x38) = RVar1 << 0x13 | 0x80000000 | part_not_end << 10 | 0xd;
  *(RK_U32 *)(lVar4 + 0x50) =
       wr_cfg.size << 0x18 | (uint)jpege_restart_marker[*(uint *)((long)hal + 0x128) & 7];
  *(int *)((long)hal + 0x128) = *(int *)((long)hal + 0x128) + 1;
  hal_jpege_vepu1_set_extra_info(*hal,syntax_00,start_mbrow);
  *(RK_U32 *)((long)hal + 0x104) = part_not_end + *(int *)((long)hal + 0x104);
  uVar3 = *(undefined4 *)((long)hal + 0x28);
  rd_cfg._8_8_ = *(undefined8 *)((long)hal + 0x18);
  ctx._4_4_ = mpp_dev_ioctl(*hal,4,&rd_cfg.size);
  if (ctx._4_4_ == MPP_OK) {
    uStack_78 = *(undefined8 *)((long)hal + 0x20);
    rd_cfg.reg._4_4_ = 0;
    rd_cfg.reg._0_4_ = uVar3;
    ctx._4_4_ = mpp_dev_ioctl(*hal,5,&stack0xffffffffffffff88);
    if (ctx._4_4_ == MPP_OK) {
      ctx._4_4_ = mpp_dev_ioctl(*hal,0xf,(void *)0x0);
      if (ctx._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_jpege_vepu1","send cmd failed %d\n","hal_jpege_vepu1_part_start",
                   (ulong)(uint)ctx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_jpege_vepu1","set register read failed %d\n","hal_jpege_vepu1_part_start",
                 (ulong)(uint)ctx._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_jpege_vepu1","set register write failed %d\n","hal_jpege_vepu1_part_start",
               (ulong)(uint)ctx._4_4_);
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave part start %p\n","hal_jpege_vepu1_part_start",hal);
  }
  return ctx._4_4_;
}

Assistant:

static MPP_RET hal_jpege_vepu1_part_start(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    JpegeSyntax *syntax = (JpegeSyntax *)task->syntax.data;
    RK_U32 mcu_w = syntax->mcu_hor_cnt;
    RK_U32 mcu_h = syntax->mcu_ver_cnt;
    RK_U32 mcu_y = ctx->mcu_y;
    RK_U32 part_mcu_h = syntax->part_rows;
    RK_U32 *regs = (RK_U32 *)ctx->regs;
    RK_U32 part_enc_h;
    RK_U32 part_enc_mcu_h;
    RK_U32 part_y_fill;
    RK_U32 part_not_end;

    hal_jpege_dbg_func("enter part start %p\n", hal);

    /* Fix register for each part encoding */
    task->part_first = !mcu_y;
    if (mcu_y + part_mcu_h < mcu_h) {
        part_enc_h = part_mcu_h * 16;
        part_enc_mcu_h = part_mcu_h;
        part_y_fill = 0;
        part_not_end = 1;
        task->part_last = 0;
    } else {
        part_enc_h = syntax->height - mcu_y * 16;
        part_enc_mcu_h = MPP_ALIGN(part_enc_h, 16) / 16;;
        part_y_fill = ctx->part_y_fill;
        part_not_end = 0;
        task->part_last = 1;
    }

    hal_jpege_dbg_detail("part first %d last %d\n", task->part_first, task->part_last);

    get_msb_lsb_at_pos(&regs[22], &regs[23], ctx->base, ctx->part_bytepos);

    regs[24] = ctx->size - ctx->part_bytepos;

    regs[15] = (regs[15] & 0xfffffc3f) | (part_y_fill << 6);

    regs[37] = ((ctx->part_bytepos & 7) * 8) << 23;

    regs[5] = mpp_buffer_get_fd(task->output);
    if (ctx->part_bytepos)
        mpp_dev_set_reg_offset(ctx->dev, 5, ctx->part_bytepos);

    regs[14] = (1 << 31) |
               (0 << 30) |
               (0 << 29) |
               (mcu_w << 19) |
               (part_enc_mcu_h << 10) |
               (1 << 3) | (2 << 1) | 1;

    regs[20] = part_not_end << 24 | jpege_restart_marker[ctx->rst_marker_idx & 7];
    ctx->rst_marker_idx++;

    hal_jpege_vepu1_set_extra_info(ctx->dev, syntax, mcu_y);
    ctx->mcu_y += part_enc_mcu_h;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = ctx->reg_size;

        wr_cfg.reg = ctx->regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = ctx->regs_out;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    hal_jpege_dbg_func("leave part start %p\n", hal);
    (void)task;
    return ret;
}